

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmCallUserFunctionAp(jx9_vm *pVm,jx9_value *pFunc,jx9_value *pResult,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long *local_140;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  sxi32 local_6c;
  uint local_68;
  sxi32 rc;
  va_list ap;
  SySet aArg;
  jx9_value *pArg;
  jx9_value *pResult_local;
  jx9_value *pFunc_local;
  jx9_vm *pVm_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  SySetInit((SySet *)&ap[0].reg_save_area,&pVm->sAllocator,8);
  ap[0].overflow_arg_area = local_128;
  ap[0]._0_8_ = &stack0x00000008;
  rc = 0x30;
  local_68 = 0x18;
  while( true ) {
    if (local_68 < 0x29) {
      local_140 = (long *)((long)(int)local_68 + (long)ap[0].overflow_arg_area);
      local_68 = local_68 + 8;
    }
    else {
      local_140 = (long *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    aArg.pUserData = (void *)*local_140;
    if (aArg.pUserData == (void *)0x0) break;
    SySetPut((SySet *)&ap[0].reg_save_area,&aArg.pUserData);
  }
  local_6c = jx9VmCallUserFunction(pVm,pFunc,(int)aArg.pBase,(jx9_value **)aArg.pAllocator,pResult);
  SySetRelease((SySet *)&ap[0].reg_save_area);
  return local_6c;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmCallUserFunctionAp(
	jx9_vm *pVm,       /* Target VM */
	jx9_value *pFunc,  /* Callback name */
	jx9_value *pResult, /* Store callback return value here. NULL otherwise */
	...                /* 0 (Zero) or more Callback arguments */ 
	)
{
	jx9_value *pArg;
	SySet aArg;
	va_list ap;
	sxi32 rc;
	SySetInit(&aArg, &pVm->sAllocator, sizeof(jx9_value *));
	/* Copy arguments one after one */
	va_start(ap, pResult);
	for(;;){
		pArg = va_arg(ap, jx9_value *);
		if( pArg == 0 ){
			break;
		}
		SySetPut(&aArg, (const void *)&pArg);
	}
	/* Call the core routine */
	rc = jx9VmCallUserFunction(&(*pVm), pFunc, (int)SySetUsed(&aArg), (jx9_value **)SySetBasePtr(&aArg), pResult);
	/* Cleanup */
	SySetRelease(&aArg);
	return rc;
}